

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QDnsServiceRecord __thiscall
QList<QDnsServiceRecord>::takeAt(QList<QDnsServiceRecord> *this,qsizetype i)

{
  pointer pQVar1;
  long in_RDX;
  
  (this->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = data((QList<QDnsServiceRecord> *)i);
  QDnsServiceRecord::QDnsServiceRecord((QDnsServiceRecord *)this,pQVar1 + in_RDX);
  if ((*(int **)i == (int *)0x0) || (1 < **(int **)i)) {
    QArrayDataPointer<QDnsServiceRecord>::reallocateAndGrow
              ((QArrayDataPointer<QDnsServiceRecord> *)i,GrowsAtEnd,0,
               (QArrayDataPointer<QDnsServiceRecord> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QDnsServiceRecord>::erase
            ((QMovableArrayOps<QDnsServiceRecord> *)i,
             (QDnsServiceRecord *)(in_RDX * 8 + *(long *)(i + 8)),1);
  return (QSharedDataPointer<QDnsServiceRecordPrivate>)
         (QSharedDataPointer<QDnsServiceRecordPrivate>)this;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }